

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O0

UniquePtr<EVP_PKEY> LoadExampleRSAKey(void)

{
  bool bVar1;
  int iVar2;
  RSA *__p;
  EVP_PKEY *pEVar3;
  pointer key;
  __uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  UniquePtr<EVP_PKEY> pkey;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_18;
  UniquePtr<RSA> rsa;
  
  __p = RSA_private_key_from_bytes(kExampleRSAKeyDER,0x260);
  std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&local_18,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18);
  if (!bVar1) {
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)
               in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,(nullptr_t)0x0);
    pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ = 1;
    goto LAB_00353388;
  }
  pEVar3 = EVP_PKEY_new();
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_28,(pointer)pEVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar1) {
    pEVar3 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
    key = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get(&local_18);
    iVar2 = EVP_PKEY_set1_RSA(pEVar3,(rsa_st *)key);
    if (iVar2 == 0) goto LAB_00353330;
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
               in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,&local_28);
  }
  else {
LAB_00353330:
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)
               in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,(nullptr_t)0x0);
  }
  pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ = 1;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
LAB_00353388:
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EVP_PKEY> LoadExampleRSAKey() {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kExampleRSAKeyDER,
                                           sizeof(kExampleRSAKeyDER)));
  if (!rsa) {
    return nullptr;
  }
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (!pkey || !EVP_PKEY_set1_RSA(pkey.get(), rsa.get())) {
    return nullptr;
  }
  return pkey;
}